

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample_bilinear_apply_interpolation.h
# Opt level: O3

void ncnn::gridsample_2d_bilinear_apply_interpolation_p4
               (Mat *src,Mat *dst,Mat *offset_value,Option *opt)

{
  float *pfVar1;
  float fVar2;
  int iVar3;
  void *pvVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  undefined1 (*pauVar9) [16];
  int *offset_ptr;
  int *piVar10;
  float fVar11;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  
  iVar3 = dst->c;
  if (0 < (long)iVar3) {
    iVar5 = dst->h * dst->w;
    lVar7 = 0;
    do {
      if (0 < iVar5) {
        lVar8 = src->cstep * lVar7 * src->elemsize;
        pvVar4 = src->data;
        piVar10 = (int *)offset_value->data;
        pauVar9 = (undefined1 (*) [16])(dst->cstep * lVar7 * dst->elemsize + (long)dst->data);
        iVar6 = iVar5;
        do {
          fVar11 = 0.0;
          fVar14 = 0.0;
          fVar15 = 0.0;
          fVar16 = 0.0;
          auVar17 = ZEXT816(0) << 0x40;
          if (-1 < (long)*piVar10) {
            auVar17 = *(undefined1 (*) [16])((long)pvVar4 + (long)*piVar10 * 4 + lVar8);
          }
          if (-1 < (long)piVar10[1]) {
            pfVar1 = (float *)((long)pvVar4 + (long)piVar10[1] * 4 + lVar8);
            fVar11 = *pfVar1;
            fVar14 = pfVar1[1];
            fVar15 = pfVar1[2];
            fVar16 = pfVar1[3];
          }
          auVar18 = ZEXT816(0) << 0x40;
          auVar13 = ZEXT816(0) << 0x40;
          if (-1 < (long)piVar10[2]) {
            auVar13 = *(undefined1 (*) [16])((long)pvVar4 + (long)piVar10[2] * 4 + lVar8);
          }
          if (-1 < (long)piVar10[3]) {
            auVar18 = *(undefined1 (*) [16])((long)pvVar4 + (long)piVar10[3] * 4 + lVar8);
          }
          fVar2 = (float)piVar10[4];
          auVar19._0_4_ = fVar2 * auVar17._0_4_;
          auVar19._4_4_ = fVar2 * auVar17._4_4_;
          auVar19._8_4_ = fVar2 * auVar17._8_4_;
          auVar19._12_4_ = fVar2 * auVar17._12_4_;
          auVar17 = vsubps_avx(auVar17,auVar19);
          auVar12._0_4_ = auVar17._0_4_ + fVar2 * fVar11;
          auVar12._4_4_ = auVar17._4_4_ + fVar2 * fVar14;
          auVar12._8_4_ = auVar17._8_4_ + fVar2 * fVar15;
          auVar12._12_4_ = auVar17._12_4_ + fVar2 * fVar16;
          auVar17 = vsubps_avx(auVar18,auVar13);
          auVar18._0_4_ = auVar17._0_4_ * fVar2 + auVar13._0_4_;
          auVar18._4_4_ = auVar17._4_4_ * fVar2 + auVar13._4_4_;
          auVar18._8_4_ = auVar17._8_4_ * fVar2 + auVar13._8_4_;
          auVar18._12_4_ = auVar17._12_4_ * fVar2 + auVar13._12_4_;
          fVar11 = (float)piVar10[5];
          auVar17 = vsubps_avx(auVar18,auVar12);
          auVar13._0_4_ = auVar17._0_4_ * fVar11 + auVar12._0_4_;
          auVar13._4_4_ = auVar17._4_4_ * fVar11 + auVar12._4_4_;
          auVar13._8_4_ = auVar17._8_4_ * fVar11 + auVar12._8_4_;
          auVar13._12_4_ = auVar17._12_4_ * fVar11 + auVar12._12_4_;
          *pauVar9 = auVar13;
          pauVar9 = pauVar9 + 1;
          piVar10 = piVar10 + 6;
          iVar6 = iVar6 + -1;
        } while (iVar6 != 0);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != iVar3);
  }
  return;
}

Assistant:

static void gridsample_2d_bilinear_apply_interpolation_p4(const Mat& src, Mat& dst, const Mat& offset_value, const Option& opt)
{
    const int channels = dst.c;
    const int outw = dst.w;
    const int outh = dst.h;
    const int grid_size = outw * outh;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* srcptr = src.channel(q);
        float* dstptr = dst.channel(q);

        const float* offset_value_ptr = offset_value.channel(0);

        for (int i = 0; i < grid_size; i++)
        {
            const int* offset_ptr = (int*)offset_value_ptr;
            const float* value_ptr = offset_value_ptr + 4;

            __m128 v00_val = offset_ptr[0] >= 0 ? _mm_loadu_ps(srcptr + offset_ptr[0]) : _mm_set1_ps(0);
            __m128 v01_val = offset_ptr[1] >= 0 ? _mm_loadu_ps(srcptr + offset_ptr[1]) : _mm_set1_ps(0);
            __m128 v10_val = offset_ptr[2] >= 0 ? _mm_loadu_ps(srcptr + offset_ptr[2]) : _mm_set1_ps(0);
            __m128 v11_val = offset_ptr[3] >= 0 ? _mm_loadu_ps(srcptr + offset_ptr[3]) : _mm_set1_ps(0);

            __m128 value1 = _mm_set1_ps(value_ptr[0]);
            __m128 v0 = _mm_comp_fmadd_ps(v01_val, value1, _mm_comp_fnmadd_ps(v00_val, value1, v00_val));
            __m128 v1 = _mm_comp_fmadd_ps(v11_val, value1, _mm_comp_fnmadd_ps(v10_val, value1, v10_val));

            __m128 value2 = _mm_set1_ps(value_ptr[1]);
            __m128 _v = _mm_comp_fmadd_ps(v1, value2, _mm_comp_fnmadd_ps(v0, value2, v0));
            _mm_storeu_ps(dstptr, _v);

            dstptr += 4;
            offset_value_ptr += 6;
        }
    }
}